

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_authorize_digest(mg_connection *c,FILE *fp)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char nc [100];
  char qop [100];
  char resp [100];
  char cnonce [100];
  char nonce [100];
  char user [100];
  char ha1 [256];
  char line [256];
  char f_domain [256];
  char f_user [256];
  char uri [16384];
  
  if (((fp != (FILE *)0x0 && c != (mg_connection *)0x0) &&
      (pcVar2 = mg_get_header(c,"Authorization"), pcVar2 != (char *)0x0)) &&
     (iVar1 = mg_strncasecmp(pcVar2,"Digest ",7), iVar1 == 0)) {
    sVar3 = strlen(pcVar2);
    iVar1 = parse_header(pcVar2,(int)sVar3,"username",user,100);
    if (iVar1 != 0) {
      sVar3 = strlen(pcVar2);
      iVar1 = parse_header(pcVar2,(int)sVar3,"cnonce",cnonce,100);
      if (iVar1 != 0) {
        sVar3 = strlen(pcVar2);
        iVar1 = parse_header(pcVar2,(int)sVar3,"response",resp,100);
        if (iVar1 != 0) {
          sVar3 = strlen(pcVar2);
          iVar1 = parse_header(pcVar2,(int)sVar3,"uri",uri,0x4000);
          if (iVar1 != 0) {
            sVar3 = strlen(pcVar2);
            iVar1 = parse_header(pcVar2,(int)sVar3,"qop",qop,100);
            if (iVar1 != 0) {
              sVar3 = strlen(pcVar2);
              iVar1 = parse_header(pcVar2,(int)sVar3,"nc",nc,100);
              if (iVar1 != 0) {
                sVar3 = strlen(pcVar2);
                iVar1 = parse_header(pcVar2,(int)sVar3,"nonce",nonce,100);
                if ((iVar1 != 0) && (pcVar2 = fgets(line,0x100,(FILE *)fp), pcVar2 != (char *)0x0))
                {
                  do {
                    iVar1 = __isoc99_sscanf(line,"%[^:]:%[^:]:%s",f_user,f_domain,ha1);
                    if (((iVar1 == 3) && (iVar1 = strcmp(user,f_user), iVar1 == 0)) &&
                       (iVar1 = strcmp(*(char **)(c[1].request_method + 0x48),f_domain), iVar1 == 0)
                       ) {
                      iVar1 = check_password(c->request_method,ha1,uri,nonce,nc,cnonce,qop,resp);
                      return iVar1;
                    }
                    pcVar2 = fgets(line,0x100,(FILE *)fp);
                  } while (pcVar2 != (char *)0x0);
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int mg_authorize_digest(struct mg_connection *c, FILE *fp) {
  struct connection *conn = MG_CONN_2_CONN(c);
  const char *hdr;
  char line[256], f_user[256], ha1[256], f_domain[256], user[100], nonce[100],
       uri[MAX_REQUEST_SIZE], cnonce[100], resp[100], qop[100], nc[100];

  if (c == NULL || fp == NULL) return 0;
  if ((hdr = mg_get_header(c, "Authorization")) == NULL ||
      mg_strncasecmp(hdr, "Digest ", 7) != 0) return 0;
  if (!mg_parse_header(hdr, "username", user, sizeof(user))) return 0;
  if (!mg_parse_header(hdr, "cnonce", cnonce, sizeof(cnonce))) return 0;
  if (!mg_parse_header(hdr, "response", resp, sizeof(resp))) return 0;
  if (!mg_parse_header(hdr, "uri", uri, sizeof(uri))) return 0;
  if (!mg_parse_header(hdr, "qop", qop, sizeof(qop))) return 0;
  if (!mg_parse_header(hdr, "nc", nc, sizeof(nc))) return 0;
  if (!mg_parse_header(hdr, "nonce", nonce, sizeof(nonce))) return 0;

  while (fgets(line, sizeof(line), fp) != NULL) {
    if (sscanf(line, "%[^:]:%[^:]:%s", f_user, f_domain, ha1) == 3 &&
        !strcmp(user, f_user) &&
        // NOTE(lsm): due to a bug in MSIE, we do not compare URIs
        !strcmp(conn->server->config_options[AUTH_DOMAIN], f_domain))
      return check_password(c->request_method, ha1, uri,
                            nonce, nc, cnonce, qop, resp);
  }
  return MG_FALSE;
}